

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::make_loo_norm(quadratic_cost_type<float> *this,int n)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  pointer __first;
  pointer pfVar4;
  float *pfVar5;
  type piVar6;
  type pqVar7;
  type pfVar8;
  int local_28;
  int e_1;
  int i_2;
  int i_1;
  int e;
  int i;
  float div;
  int n_local;
  quadratic_cost_type<float> *this_local;
  
  i = n;
  _div = this;
  __first = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->linear_elements);
  pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->linear_elements);
  pfVar5 = std::max_element<float*>(__first,pfVar4 + i);
  e = (int)*pfVar5;
  i_1 = 0;
  piVar6 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)i);
  iVar1 = *piVar6;
  for (; i_1 != iVar1; i_1 = i_1 + 1) {
    pqVar7 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)i_1);
    pfVar5 = std::max<float>(&pqVar7->factor,(float *)&e);
    e = (int)*pfVar5;
  }
  bVar3 = std::isnormal((float)e);
  if (bVar3) {
    for (e_1 = 0; iVar1 = e, e_1 != i; e_1 = e_1 + 1) {
      pfVar8 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         (&this->linear_elements,(long)e_1);
      *pfVar8 = *pfVar8 / (float)iVar1;
    }
    local_28 = 0;
    piVar6 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)i)
    ;
    iVar1 = *piVar6;
    for (; iVar2 = e, local_28 != iVar1; local_28 = local_28 + 1) {
      pqVar7 = std::
               unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               ::operator[](&this->quadratic_elements,(long)local_28);
      pqVar7->factor = pqVar7->factor / (float)iVar2;
    }
  }
  return;
}

Assistant:

void make_loo_norm(int n)
    {
        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div = std::max(quadratic_elements[i].factor, div);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }